

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_main.c
# Opt level: O0

int optint(char *key,int opt)

{
  char *__nptr;
  long lVar1;
  char local_48 [8];
  char tmp [20];
  char *str;
  int opt_local;
  char *key_local;
  
  __nptr = skynet_getenv(key);
  if (__nptr == (char *)0x0) {
    sprintf(local_48,"%d",(ulong)(uint)opt);
    skynet_setenv(key,local_48);
    key_local._4_4_ = opt;
  }
  else {
    lVar1 = strtol(__nptr,(char **)0x0,10);
    key_local._4_4_ = (int)lVar1;
  }
  return key_local._4_4_;
}

Assistant:

static int
optint(const char *key, int opt) {
	const char * str = skynet_getenv(key);
	if (str == NULL) {
		char tmp[20];
		sprintf(tmp,"%d",opt);
		skynet_setenv(key, tmp);
		return opt;
	}
	return strtol(str, NULL, 10);
}